

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void picojson::serialize_str<std::back_insert_iterator<std::__cxx11::string>>
               (string *s,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               oi)

{
  char cVar1;
  bool bVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar3;
  reference pcVar4;
  byte *pbVar5;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  value_type local_1e9;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string *local_1d8;
  char local_1cf [6];
  char cStack_1c9;
  string *psStack_1c8;
  char buf [7];
  allocator local_1b9;
  string local_1b8;
  string *local_198;
  allocator local_189;
  string local_188;
  string *local_168;
  allocator local_159;
  string local_158;
  string *local_138;
  allocator local_129;
  string local_128;
  string *local_108;
  allocator local_f9;
  string local_f8;
  string *local_d8;
  allocator local_c9;
  string local_c8;
  string *local_a8;
  allocator local_99;
  string local_98;
  string *local_78;
  allocator local_59;
  string local_58;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator i;
  value_type local_19;
  string *local_18;
  string *s_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  oi_local;
  
  local_19 = '\"';
  local_18 = s;
  s_local = oi.container;
  i._M_current = (char *)std::
                         back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&s_local,0);
  pbVar3 = std::
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&i);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(pbVar3,&local_19);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_38._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_30);
    cVar1 = *pcVar4;
    if (cVar1 == '\b') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"\\b",&local_f9);
      local_108 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_f8,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    else if (cVar1 == '\t') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b8,"\\t",&local_1b9);
      psStack_1c8 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_1b8,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    }
    else if (cVar1 == '\n') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"\\n",&local_159);
      local_168 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_158,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    else if (cVar1 == '\f') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_128,"\\f",&local_129);
      local_138 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_128,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    else if (cVar1 == '\r') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"\\r",&local_189);
      local_198 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_188,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
    }
    else if (cVar1 == '\"') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_58,"\\\"",&local_59);
      local_78 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_58,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    else if (cVar1 == '/') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"\\/",&local_c9);
      local_d8 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_c8,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    else if (cVar1 == '\\') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,"\\\\",&local_99);
      local_a8 = s_local;
      copy<std::back_insert_iterator<std::__cxx11::string>>
                (&local_98,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )s_local);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      pbVar5 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_30);
      if ((*pbVar5 < 0x20) ||
         (pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30), *pcVar4 == '\x7f')) {
        pbVar5 = (byte *)__gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_30);
        snprintf(local_1cf,7,"\\u%04x",(ulong)*pbVar5);
        local_1d8 = s_local;
        local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::copy<char*,std::back_insert_iterator<std::__cxx11::string>>
                              (local_1cf,&cStack_1c9,
                               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )s_local);
      }
      else {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_30);
        local_1e8 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&s_local,0);
        pbVar3 = std::
                 back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1e8);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(pbVar3,pcVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  local_1e9 = '\"';
  local_1f8 = std::
              back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&s_local,0);
  pbVar3 = std::
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_1f8);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(pbVar3,&local_1e9);
  return;
}

Assistant:

void serialize_str(const std::string& s, Iter oi) {
    *oi++ = '"';
    for (std::string::const_iterator i = s.begin(); i != s.end(); ++i) {
      switch (*i) {
#define MAP(val, sym) case val: copy(sym, oi); break
	MAP('"', "\\\"");
	MAP('\\', "\\\\");
	MAP('/', "\\/");
	MAP('\b', "\\b");
	MAP('\f', "\\f");
	MAP('\n', "\\n");
	MAP('\r', "\\r");
	MAP('\t', "\\t");
#undef MAP
      default:
	if (static_cast<unsigned char>(*i) < 0x20 || *i == 0x7f) {
	  char buf[7];
	  SNPRINTF(buf, sizeof(buf), "\\u%04x", *i & 0xff);
	  copy(buf, buf + 6, oi);
	  } else {
	  *oi++ = *i;
	}
	break;
      }
    }
    *oi++ = '"';
  }